

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageSamplingInstance.cpp
# Opt level: O0

MovePtr<tcu::TextureCubeView,_de::DefaultDeleter<tcu::TextureCubeView>_> *
vkt::pipeline::anon_unknown_0::getTextureCubeView
          (MovePtr<tcu::TextureCubeView,_de::DefaultDeleter<tcu::TextureCubeView>_>
           *__return_storage_ptr__,TestTexture *testTexture,VkImageSubresourceRange *subresource,
          vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *levels)

{
  int iVar1;
  int width;
  int height;
  TextureLevelPyramid *this;
  undefined4 extraout_var;
  reference pvVar2;
  TextureCubeView *this_00;
  int local_10c;
  ConstPixelBufferAccess *local_f8;
  long *local_f0;
  TestTextureCubeArray *local_e0;
  DefaultDeleter<tcu::TextureCubeView> local_bd [17];
  int local_ac;
  int faceNdx_1;
  ConstPixelBufferAccess *reordered [6];
  ConstPixelBufferAccess local_70;
  ConstPixelBufferAccess *local_48;
  ConstPixelBufferAccess *srcLevel;
  int levelNdx;
  int faceNdx;
  TestTextureCubeArray *texCubeArray;
  TestTextureCube *texCube;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *levels_local;
  VkImageSubresourceRange *subresource_local;
  TestTexture *testTexture_local;
  
  texCube = (TestTextureCube *)levels;
  levels_local = (vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                  *)subresource;
  subresource_local = (VkImageSubresourceRange *)testTexture;
  testTexture_local = (TestTexture *)__return_storage_ptr__;
  if (testTexture == (TestTexture *)0x0) {
    local_e0 = (TestTextureCubeArray *)0x0;
  }
  else {
    local_e0 = (TestTextureCubeArray *)
               __dynamic_cast(testTexture,&TestTexture::typeinfo,&TestTextureCube::typeinfo,0);
  }
  texCubeArray = local_e0;
  if (subresource_local == (VkImageSubresourceRange *)0x0) {
    local_f0 = (long *)0x0;
  }
  else {
    local_f0 = (long *)__dynamic_cast(subresource_local,&TestTexture::typeinfo,
                                      &TestTextureCubeArray::typeinfo,0);
  }
  _levelNdx = local_f0;
  std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::resize
            ((vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *)
             texCube,(ulong)(uint)(*(int *)&(levels_local->
                                            super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                            )._M_impl.super__Vector_impl_data._M_finish * 6));
  for (srcLevel._4_4_ = 0; srcLevel._4_4_ < 6; srcLevel._4_4_ = srcLevel._4_4_ + 1) {
    for (srcLevel._0_4_ = 0;
        (int)srcLevel <
        *(int *)&(levels_local->
                 super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                 )._M_impl.super__Vector_impl_data._M_finish; srcLevel._0_4_ = (int)srcLevel + 1) {
      if (_levelNdx == (long *)0x0) {
        iVar1 = (*(texCubeArray->super_TestTexture)._vptr_TestTexture[0x10])();
        local_f8 = tcu::TextureCube::getLevelFace
                             ((TextureCube *)CONCAT44(extraout_var,iVar1),(int)srcLevel,
                              getTextureCubeView::s_faceMap[srcLevel._4_4_]);
      }
      else {
        this = (TextureLevelPyramid *)(**(code **)(*_levelNdx + 0x80))();
        local_f8 = tcu::TextureLevelPyramid::getLevel
                             (this,*(int *)((long)&(levels_local->
                                                                                                      
                                                  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                                  )._M_impl.super__Vector_impl_data._M_start + 4) +
                                   (int)srcLevel);
      }
      local_48 = local_f8;
      iVar1 = *(int *)((long)&(levels_local->
                              super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                              )._M_impl.super__Vector_impl_data._M_finish + 4);
      if (_levelNdx == (long *)0x0) {
        local_10c = 0;
      }
      else {
        local_10c = srcLevel._4_4_;
      }
      width = tcu::ConstPixelBufferAccess::getWidth(local_f8);
      height = tcu::ConstPixelBufferAccess::getHeight(local_48);
      tcu::getSubregion(&local_70,local_f8,0,0,iVar1 + local_10c,width,height,1);
      pvVar2 = std::
               vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
               operator[]((vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                           *)texCube,
                          (ulong)(uint)(srcLevel._4_4_ *
                                        *(int *)&(levels_local->
                                                 super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                                 )._M_impl.super__Vector_impl_data._M_finish +
                                       (int)srcLevel));
      memcpy(pvVar2,&local_70,0x28);
    }
  }
  for (local_ac = 0; local_ac < 6; local_ac = local_ac + 1) {
    pvVar2 = std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
             ::operator[]((vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                           *)texCube,
                          (ulong)(uint)(local_ac *
                                       *(int *)&(levels_local->
                                                super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                                )._M_impl.super__Vector_impl_data._M_finish));
    *(reference *)(&stack0xffffffffffffff58 + (ulong)getTextureCubeView::s_faceMap[local_ac] * 8) =
         pvVar2;
  }
  this_00 = (TextureCubeView *)operator_new(0x38);
  tcu::TextureCubeView::TextureCubeView
            (this_00,*(int *)&(levels_local->
                              super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                              )._M_impl.super__Vector_impl_data._M_finish,
             (ConstPixelBufferAccess *(*) [6])&stack0xffffffffffffff58);
  de::DefaultDeleter<tcu::TextureCubeView>::DefaultDeleter(local_bd);
  de::details::MovePtr<tcu::TextureCubeView,_de::DefaultDeleter<tcu::TextureCubeView>_>::MovePtr
            (__return_storage_ptr__,this_00);
  return __return_storage_ptr__;
}

Assistant:

MovePtr<tcu::TextureCubeView> getTextureCubeView (const TestTexture& testTexture, const vk::VkImageSubresourceRange& subresource, std::vector<tcu::ConstPixelBufferAccess>& levels)
{
	const static tcu::CubeFace s_faceMap[tcu::CUBEFACE_LAST] =
	{
		tcu::CUBEFACE_POSITIVE_X,
		tcu::CUBEFACE_NEGATIVE_X,
		tcu::CUBEFACE_POSITIVE_Y,
		tcu::CUBEFACE_NEGATIVE_Y,
		tcu::CUBEFACE_POSITIVE_Z,
		tcu::CUBEFACE_NEGATIVE_Z
	};

	const TestTextureCube*		texCube			= dynamic_cast<const TestTextureCube*>(&testTexture);
	const TestTextureCubeArray*	texCubeArray	= dynamic_cast<const TestTextureCubeArray*>(&testTexture);

	DE_ASSERT(!!texCube != !!texCubeArray);
	DE_ASSERT(subresource.layerCount == 6);
	DE_ASSERT(texCubeArray || subresource.baseArrayLayer == 0);

	levels.resize(subresource.levelCount*tcu::CUBEFACE_LAST);

	for (int faceNdx = 0; faceNdx < tcu::CUBEFACE_LAST; ++faceNdx)
	{
		for (int levelNdx = 0; levelNdx < (int)subresource.levelCount; ++levelNdx)
		{
			const tcu::ConstPixelBufferAccess& srcLevel = texCubeArray ? texCubeArray->getTexture().getLevel((int)subresource.baseMipLevel+levelNdx)
																	   : texCube->getTexture().getLevelFace(levelNdx, s_faceMap[faceNdx]);

			levels[faceNdx*subresource.levelCount + levelNdx] = tcu::getSubregion(srcLevel, 0, 0, (int)subresource.baseArrayLayer + (texCubeArray ? faceNdx : 0), srcLevel.getWidth(), srcLevel.getHeight(), 1);
		}
	}

	{
		const tcu::ConstPixelBufferAccess*	reordered[tcu::CUBEFACE_LAST];

		for (int faceNdx = 0; faceNdx < tcu::CUBEFACE_LAST; ++faceNdx)
			reordered[s_faceMap[faceNdx]] = &levels[faceNdx*subresource.levelCount];

		return MovePtr<tcu::TextureCubeView>(new tcu::TextureCubeView((int)subresource.levelCount, reordered));
	}
}